

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O3

void stable_bubble_sort(int **dst,size_t size)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  int *_sort_swap_temp;
  size_t n;
  
  if (size != 0) {
    do {
      if (size < 2) {
        return;
      }
      uVar2 = 1;
      uVar3 = 0;
      do {
        piVar1 = dst[uVar2 - 1];
        if (*dst[uVar2] < *piVar1) {
          dst[uVar2 - 1] = dst[uVar2];
          dst[uVar2] = piVar1;
          uVar3 = uVar2;
        }
        uVar2 = uVar2 + 1;
      } while (size != uVar2);
      size = uVar3;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void BUBBLE_SORT(SORT_TYPE *dst, const size_t size) {
  size_t n = size;

  while (n) {
    size_t i, newn = 0U;

    for (i = 1U; i < n; ++i) {
      if (SORT_CMP(dst[i - 1U], dst[i]) > 0) {
        SORT_SWAP(dst[i - 1U], dst[i]);
        newn = i;
      }
    }

    n = newn;
  }
}